

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

Gia_Man_t * Abc_GenSignedBooth(int nArgN,int nArgM)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar4;
  int *piVar5;
  Gia_Man_t *p_02;
  char *pcVar6;
  Gia_Man_t *pGVar7;
  int local_bc;
  int local_ac;
  bool local_8d;
  int local_8c;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  int *pArgM;
  int *pArgN;
  Vec_Int_t *vArgM;
  Vec_Int_t *vArgN;
  Vec_Int_t *vPPs;
  int local_20;
  int iLit;
  int k;
  int i;
  int Length;
  int nWidth;
  int nArgM_local;
  int nArgN_local;
  
  iVar1 = nArgN + nArgM + 1;
  iVar2 = (nArgM + 1) / 2;
  p = Vec_IntAlloc(iVar1 * (iVar2 + 1));
  p_00 = Vec_IntAlloc(nArgN + 2);
  p_01 = Vec_IntAlloc(nArgM + 2);
  piVar4 = Vec_IntArray(p_00);
  piVar5 = Vec_IntArray(p_01);
  p_02 = Gia_ManStart(1000);
  pcVar6 = Abc_UtilStrsav("booth");
  p_02->pName = pcVar6;
  Vec_IntPush(p_00,0);
  for (iLit = 0; iLit < nArgN; iLit = iLit + 1) {
    iVar3 = Gia_ManAppendCi(p_02);
    Vec_IntPush(p_00,iVar3);
  }
  iVar3 = Vec_IntEntryLast(p_00);
  Vec_IntPush(p_00,iVar3);
  Vec_IntPush(p_01,0);
  for (iLit = 0; iLit < nArgM; iLit = iLit + 1) {
    iVar3 = Gia_ManAppendCi(p_02);
    Vec_IntPush(p_01,iVar3);
  }
  iVar3 = Vec_IntEntryLast(p_01);
  Vec_IntPush(p_01,iVar3);
  for (iLit = 0; iLit < iVar1; iLit = iLit + 1) {
    if ((iLit % 2 == 0) && (iLit / 2 < iVar2)) {
      local_8c = piVar5[iLit + 2];
    }
    else {
      local_8c = 0;
    }
    Vec_IntPush(p,local_8c);
  }
  Gia_ManHashAlloc(p_02);
  for (local_20 = 0; SBORROW4(local_20,iVar2 * 2) != local_20 + iVar2 * -2 < 0;
      local_20 = local_20 + 2) {
    for (iLit = 0; iLit < local_20; iLit = iLit + 1) {
      Vec_IntPush(p,0);
    }
    for (iLit = 0; iLit <= nArgN; iLit = iLit + 1) {
      iVar3 = Abc_GenSignedBoothPP
                        (p_02,piVar4[iLit],piVar4[iLit + 1],piVar5[local_20],piVar5[local_20 + 1],
                         piVar5[local_20 + 2]);
      local_8d = 0 < local_20 && iLit == nArgN;
      iVar3 = Abc_LitNotCond(iVar3,(uint)local_8d);
      Vec_IntPush(p,iVar3);
    }
    iVar3 = Vec_IntEntryLast(p);
    local_ac = iVar3;
    if (0 < local_20) {
      local_ac = 1;
    }
    Vec_IntPush(p,local_ac);
    for (iLit = local_20 + nArgN + 2; iLit < iVar1; iLit = iLit + 1) {
      if ((local_20 < 1) && (iLit <= local_20 + nArgN + 2)) {
        local_bc = Abc_LitNot(iVar3);
      }
      else {
        local_bc = 0;
      }
      Vec_IntPush(p,local_bc);
    }
  }
  Gia_ManHashStop(p_02);
  for (local_20 = 0; local_20 <= iVar2; local_20 = local_20 + 1) {
    for (iLit = 0; iLit < nArgN + nArgM; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(p,local_20 * (nArgN + nArgM + 1) + iLit);
      Gia_ManAppendCo(p_02,iVar1);
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  pGVar7 = Gia_ManCleanup(p_02);
  Gia_ManStop(p_02);
  return pGVar7;
}

Assistant:

Gia_Man_t * Abc_GenSignedBooth( int nArgN, int nArgM )
{
    int nWidth = nArgN + nArgM + 1;
    int Length = (nArgM + 1) / 2;
    int i, k, iLit;

    Vec_Int_t * vPPs  = Vec_IntAlloc( nWidth * (Length + 1) );
    Vec_Int_t * vArgN = Vec_IntAlloc( nArgN + 2 );
    Vec_Int_t * vArgM = Vec_IntAlloc( nArgM + 2 );
    int * pArgN = Vec_IntArray( vArgN );
    int * pArgM = Vec_IntArray( vArgM );

    Gia_Man_t * pTemp, * pNew; 
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "booth" );

    Vec_IntPush( vArgN, 0 );
    for ( i = 0; i < nArgN; i++ )
        Vec_IntPush( vArgN, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgN, Vec_IntEntryLast(vArgN) );

    Vec_IntPush( vArgM, 0 );
    for ( i = 0; i < nArgM; i++ )
        Vec_IntPush( vArgM, Gia_ManAppendCi(pNew) );
    Vec_IntPush( vArgM, Vec_IntEntryLast(vArgM) );

    for ( i = 0; i < nWidth; i++ )
        Vec_IntPush( vPPs, (i%2 == 0 && i/2 < Length) ? pArgM[i+2] : 0 );

    Gia_ManHashAlloc( pNew );
    for ( k = 0; k < 2*Length; k += 2 )
    {
        for ( i = 0; i < k; i++ )
            Vec_IntPush( vPPs, 0 );
        for ( i = 0; i <= nArgN; i++ )
        {
            iLit = Abc_GenSignedBoothPP( pNew, pArgN[i], pArgN[i+1], pArgM[k], pArgM[k+1], pArgM[k+2] );
            Vec_IntPush( vPPs, Abc_LitNotCond( iLit, k > 0 && i == nArgN ) );
        }
        iLit = Vec_IntEntryLast(vPPs);
        Vec_IntPush( vPPs, k > 0 ? 1 : iLit );
        for ( i = k+nArgN+2; i < nWidth; i++ )
            Vec_IntPush( vPPs, (k > 0 || i > k+nArgN+2) ? 0 : Abc_LitNot(iLit) );
    }
    Gia_ManHashStop( pNew );

    for ( k = 0; k <= Length; k++ )
        for ( i = 0; i < nArgN+nArgM; i++ )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vPPs, k*(nArgN+nArgM+1) + i) );
    Vec_IntFree( vPPs );
    Vec_IntFree( vArgN );
    Vec_IntFree( vArgM );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}